

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_integer_literal(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  basic_variable<std::allocator<char>_> *local_a28;
  basic_variable<std::allocator<char>_> *local_a10;
  basic_variable<std::allocator<char>_> *local_9f8;
  basic_variable<std::allocator<char>_> *local_9e0;
  basic_variable<std::allocator<char>_> *local_9a8;
  basic_variable<std::allocator<char>_> *local_990;
  basic_variable<std::allocator<char>_> *local_978;
  basic_variable<std::allocator<char>_> *local_960;
  undefined1 local_931;
  basic_variable<std::allocator<char>_> *local_930;
  basic_variable<std::allocator<char>_> local_928;
  basic_variable<std::allocator<char>_> local_8f8;
  basic_variable<std::allocator<char>_> local_8c8;
  undefined1 local_898 [69];
  undefined1 local_853 [2];
  undefined1 local_851;
  basic_variable<std::allocator<char>_> *local_850;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7b8 [69];
  undefined1 local_773 [2];
  undefined1 local_771;
  basic_variable<std::allocator<char>_> *local_770;
  basic_variable<std::allocator<char>_> local_768;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  undefined1 local_6d8 [69];
  undefined1 local_693 [2];
  undefined1 local_691;
  basic_variable<std::allocator<char>_> *local_690;
  basic_variable<std::allocator<char>_> local_688;
  basic_variable<std::allocator<char>_> local_658;
  basic_variable<std::allocator<char>_> local_628;
  undefined1 local_5f8 [77];
  undefined1 local_5ab [2];
  undefined1 local_5a9;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_56b [2];
  undefined1 local_569;
  basic_variable<std::allocator<char>_> local_568;
  undefined1 local_52b [2];
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4ae [2];
  uint local_4ac [2];
  uint big_1;
  uint zero_1;
  basic_variable<std::allocator<char>_> local_498;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_408 [69];
  undefined1 local_3c3 [2];
  undefined1 local_3c1;
  basic_variable<std::allocator<char>_> *local_3c0;
  basic_variable<std::allocator<char>_> local_3b8;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_328 [69];
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_248 [69];
  undefined1 local_203 [2];
  undefined1 local_201;
  basic_variable<std::allocator<char>_> *local_200;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_168 [77];
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  int local_10 [2];
  int big;
  int zero;
  
  local_10[1] = 0;
  local_10[0] = 0x7fffffff;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_12[0] = trial::dynamic::operator==(&local_48,local_10 + 1);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc92,"void equality_suite::compare_array_equal_integer_literal()",local_12,&local_49)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_5e[0] = trial::dynamic::operator!=(&local_98,local_10 + 1);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc93,"void equality_suite::compare_array_equal_integer_literal()",local_5e,&local_99)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9b[0] = trial::dynamic::operator==(&local_d8,local_10);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc94,"void equality_suite::compare_array_equal_integer_literal()",local_9b,&local_d9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_db[0] = trial::dynamic::operator!=(&local_118,local_10);
  local_119 = 1;
  sVar1 = 0xc95;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc95,"void equality_suite::compare_array_equal_integer_literal()",local_db,&local_119
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_200 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,1);
  local_200 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,2);
  local_200 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,3);
  local_168._0_8_ = &local_1f8;
  local_168._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_array<std::allocator<char>_> *)local_168._0_8_,init);
  local_11b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),local_10 + 1
                           );
  local_201 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc97,"void equality_suite::compare_array_equal_integer_literal()",local_11b,
             &local_201);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  pbVar2 = &local_1f8;
  local_960 = (basic_variable<std::allocator<char>_> *)local_168;
  do {
    local_960 = local_960 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_960);
  } while (local_960 != pbVar2);
  local_2e0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,1);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,2);
  local_2e0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,3);
  local_248._0_8_ = &local_2d8;
  local_248._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_248._0_8_,init_00);
  local_203[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),local_10 + 1
                           );
  local_2e1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc98,"void equality_suite::compare_array_equal_integer_literal()",local_203,
             &local_2e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  pbVar2 = &local_2d8;
  local_978 = (basic_variable<std::allocator<char>_> *)local_248;
  do {
    local_978 = local_978 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_978);
  } while (local_978 != pbVar2);
  local_3c0 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,1);
  local_3c0 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,2);
  local_3c0 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,3);
  local_328._0_8_ = &local_3b8;
  local_328._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
             (basic_array<std::allocator<char>_> *)local_328._0_8_,init_01);
  local_2e3[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),local_10);
  local_3c1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc99,"void equality_suite::compare_array_equal_integer_literal()",local_2e3,
             &local_3c1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10));
  pbVar2 = &local_3b8;
  local_990 = (basic_variable<std::allocator<char>_> *)local_328;
  do {
    local_990 = local_990 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_990);
  } while (local_990 != pbVar2);
  _zero_1 = &local_498;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(_zero_1,1);
  _zero_1 = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(_zero_1,2);
  _zero_1 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(_zero_1,3);
  local_408._0_8_ = &local_498;
  local_408._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),
             (basic_array<std::allocator<char>_> *)local_408._0_8_,init_02);
  local_3c3[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),local_10);
  big_1._3_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc9a,"void equality_suite::compare_array_equal_integer_literal()",local_3c3,
             (long)&big_1 + 3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  local_9a8 = (basic_variable<std::allocator<char>_> *)local_408;
  do {
    local_9a8 = local_9a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9a8);
  } while (local_9a8 != &local_498);
  local_4ac[1] = 0;
  local_4ac[0] = 0xffffffff;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_4ae[0] = trial::dynamic::operator==(&local_4e8,local_4ac + 1);
  local_4e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca0,"void equality_suite::compare_array_equal_integer_literal()",local_4ae,
             &local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_4eb[0] = trial::dynamic::operator!=(&local_528,local_4ac + 1);
  local_529 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca1,"void equality_suite::compare_array_equal_integer_literal()",local_4eb,
             &local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_52b[0] = trial::dynamic::operator==(&local_568,local_4ac);
  local_569 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca2,"void equality_suite::compare_array_equal_integer_literal()",local_52b,
             &local_569);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_568);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_56b[0] = trial::dynamic::operator!=(&local_5a8,local_4ac);
  local_5a9 = 1;
  sVar1 = 0xca3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca3,"void equality_suite::compare_array_equal_integer_literal()",local_56b,
             &local_5a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5a8);
  local_690 = &local_688;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_690,1);
  local_690 = &local_658;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_690,2);
  local_690 = &local_628;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_690,3);
  local_5f8._0_8_ = &local_688;
  local_5f8._8_8_ = 3;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_5f8._0_8_,init_03);
  local_5ab[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10),
                            local_4ac + 1);
  local_691 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca5,"void equality_suite::compare_array_equal_integer_literal()",local_5ab,
             &local_691);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10));
  pbVar2 = &local_688;
  local_9e0 = (basic_variable<std::allocator<char>_> *)local_5f8;
  do {
    local_9e0 = local_9e0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9e0);
  } while (local_9e0 != pbVar2);
  local_770 = &local_768;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_770,1);
  local_770 = &local_738;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_770,2);
  local_770 = &local_708;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_770,3);
  local_6d8._0_8_ = &local_768;
  local_6d8._8_8_ = 3;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6d8._0_8_,init_04);
  local_693[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10),
                            local_4ac + 1);
  local_771 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca6,"void equality_suite::compare_array_equal_integer_literal()",local_693,
             &local_771);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6d8 + 0x10));
  pbVar2 = &local_768;
  local_9f8 = (basic_variable<std::allocator<char>_> *)local_6d8;
  do {
    local_9f8 = local_9f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9f8);
  } while (local_9f8 != pbVar2);
  local_850 = &local_848;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,1);
  local_850 = &local_818;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,2);
  local_850 = &local_7e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_850,3);
  local_7b8._0_8_ = &local_848;
  local_7b8._8_8_ = 3;
  init_05._M_len = (size_type)pbVar2;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7b8._0_8_,init_05);
  local_773[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10),local_4ac);
  local_851 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca7,"void equality_suite::compare_array_equal_integer_literal()",local_773,
             &local_851);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7b8 + 0x10));
  pbVar2 = &local_848;
  local_a10 = (basic_variable<std::allocator<char>_> *)local_7b8;
  do {
    local_a10 = local_a10 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a10);
  } while (local_a10 != pbVar2);
  local_930 = &local_928;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_930,1);
  local_930 = &local_8f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_930,2);
  local_930 = &local_8c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_930,3);
  local_898._0_8_ = &local_928;
  local_898._8_8_ = 3;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),
             (basic_array<std::allocator<char>_> *)local_898._0_8_,init_06);
  local_853[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),local_4ac);
  local_931 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xca8,"void equality_suite::compare_array_equal_integer_literal()",local_853,
             &local_931);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  local_a28 = (basic_variable<std::allocator<char>_> *)local_898;
  do {
    local_a28 = local_a28 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a28);
  } while (local_a28 != &local_928);
  return;
}

Assistant:

void compare_array_equal_integer_literal()
{
    {
        const auto zero = 0;
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != big, true);
    }
    {
        const auto zero = 0U;
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != big, true);
    }
}